

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O2

void start_subcommand(strbuf *args)

{
  int iVar1;
  __pid_t _Var2;
  char **__argv;
  char *pcVar3;
  size_t i;
  size_t sVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  
  iVar1 = pipe(signalpipe);
  if (iVar1 < 0) {
    pcVar7 = "pipe";
  }
  else {
    putty_signal(0x11,sigchld);
    lVar5 = 0;
    for (sVar4 = 0; args->len != sVar4; sVar4 = sVar4 + 1) {
      lVar5 = lVar5 + (ulong)(args->s[sVar4] == '\0');
    }
    __argv = (char **)safemalloc(lVar5 + 1,8,0);
    pcVar7 = args->s;
    for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
      __argv[lVar6] = pcVar7;
      pcVar3 = (char *)strlen(pcVar7);
      if (args->s + (args->len - (long)pcVar7) <= pcVar3) {
        __assert_fail("len < args->len - (p - args->s)",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/psocks.c"
                      ,0x6f,"void start_subcommand(strbuf *)");
      }
      pcVar7 = pcVar7 + (long)(pcVar3 + 1);
    }
    __argv[lVar5] = (char *)0x0;
    _Var2 = fork();
    if (-1 < _Var2) {
      if (_Var2 != 0) {
        subcommand_pid = _Var2;
        safefree(__argv);
        return;
      }
      execvp(*__argv,__argv);
      perror("exec");
      _exit(0x7f);
    }
    pcVar7 = "fork";
  }
  perror(pcVar7);
  exit(1);
}

Assistant:

static void start_subcommand(strbuf *args)
{
    pid_t pid;

    /*
     * Set up the pipe we'll use to tell us about SIGCHLD.
     */
    if (pipe(signalpipe) < 0) {
        perror("pipe");
        exit(1);
    }
    putty_signal(SIGCHLD, sigchld);

    /*
     * Make an array of argument pointers that execvp will like.
     */
    size_t nargs = 0;
    for (size_t i = 0; i < args->len; i++)
        if (args->s[i] == '\0')
            nargs++;

    char **exec_args = snewn(nargs + 1, char *);
    char *p = args->s;
    for (size_t a = 0; a < nargs; a++) {
        exec_args[a] = p;
        size_t len = strlen(p);
        assert(len < args->len - (p - args->s));
        p += 1 + len;
    }
    exec_args[nargs] = NULL;

    pid = fork();
    if (pid < 0) {
        perror("fork");
        exit(1);
    } else if (pid == 0) {
        execvp(exec_args[0], exec_args);
        perror("exec");
        _exit(127);
    } else {
        subcommand_pid = pid;
        sfree(exec_args);
    }
}